

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_RAX;
  size_t sVar4;
  long lVar5;
  long id_1;
  long local_18;
  
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmPolicies.cxx"
                  ,0xe,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  local_18 = in_RAX;
  sVar4 = strlen(id);
  if ((sVar4 == 7) && (iVar3 = strncmp(id,"CMP",3), iVar3 == 0)) {
    bVar2 = cmHasLiteralSuffix<char_const*,5ul>(id,(char (*) [5])0x4faf6f);
    if (bVar2) {
      *pid = CMP0000;
      return true;
    }
    if ((int)id[3] - 0x30U < 10) {
      lVar1 = 0;
      do {
        lVar5 = lVar1;
        if (lVar5 == 3) goto LAB_002e5053;
        lVar1 = lVar5 + 1;
      } while ((int)id[lVar5 + 4] - 0x30U < 10);
      if (5 < lVar5 + 3U) {
LAB_002e5053:
        bVar2 = cmSystemTools::StringToLong(id + 3,&local_18);
        if ((bVar2) && (local_18 < 0x40)) {
          *pid = (PolicyID)local_18;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool stringToId(const char* input, cmPolicies::PolicyID& pid)
{
  assert(input);
  if (strlen(input) != 7)
    {
    return false;
    }
  if (!cmHasLiteralPrefix(input, "CMP"))
    {
    return false;
    }
  if (cmHasLiteralSuffix(input, "0000"))
    {
    pid = cmPolicies::CMP0000;
    return true;
    }
  for (int i = 3; i < 7; ++i)
    {
    if (!isdigit(*(input + i)))
      {
      return false;
      }
    }
  long id;
  if (!cmSystemTools::StringToLong(input + 3, &id))
    {
    return false;
    }
  if (id >= cmPolicies::CMPCOUNT)
    {
    return false;
    }
  pid = cmPolicies::PolicyID(id);
  return true;
}